

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error __thiscall asmjit::Logger::logv(Logger *this,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  Error EVar2;
  __gnuc_va_list in_RDX;
  char *in_RSI;
  long *in_RDI;
  size_t len;
  char buf [1024];
  ulong local_440;
  char local_438 [1056];
  ulong local_18;
  char *local_10;
  
  iVar1 = vsnprintf(local_438,0x400,in_RSI,in_RDX);
  local_440 = (ulong)iVar1;
  if (0x3ff < local_440) {
    local_440 = 0x3ff;
  }
  local_10 = local_438;
  local_18 = local_440;
  EVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_10,local_440);
  return EVar2;
}

Assistant:

Error Logger::logv(const char* fmt, va_list ap) noexcept {
  char buf[1024];
  size_t len = vsnprintf(buf, sizeof(buf), fmt, ap);

  if (len >= sizeof(buf))
    len = sizeof(buf) - 1;
  return log(buf, len);
}